

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_p_p.h
# Opt level: O2

void __thiscall
QNativeSocketEnginePrivate::setPortAndAddress
          (QNativeSocketEnginePrivate *this,quint16 port,QHostAddress *address,qt_sockaddr *aa,
          socklen_t *sockAddrSize)

{
  NetworkLayerProtocol NVar1;
  NetworkLayerProtocol NVar2;
  socklen_t sVar3;
  
  NVar1 = (this->super_QAbstractSocketEnginePrivate).socketProtocol;
  if ((uint)(NVar1 + UnknownNetworkLayerProtocol) < 2) {
LAB_00218054:
    anon_unknown.dwarf_94bbba::setSockaddr(&aa->a6,address,port);
    sVar3 = 0x1c;
  }
  else {
    if (NVar1 != IPv4Protocol) {
      NVar2 = QHostAddress::protocol(address);
      if ((uint)(NVar2 + UnknownNetworkLayerProtocol) < 2) goto LAB_00218054;
      if (NVar2 != IPv4Protocol) {
        *(undefined8 *)aa = 0;
        ((char *)((long)aa + 2))[6] = '\0';
        ((char *)((long)aa + 2))[7] = '\0';
        ((char *)((long)aa + 2))[8] = '\0';
        ((char *)((long)aa + 2))[9] = '\0';
        ((char *)((long)aa + 2))[10] = '\0';
        ((char *)((long)aa + 2))[0xb] = '\0';
        ((char *)((long)aa + 2))[0xc] = '\0';
        ((char *)((long)aa + 2))[0xd] = '\0';
        sVar3 = 0;
        goto LAB_0021807b;
      }
    }
    anon_unknown.dwarf_94bbba::setSockaddr(&aa->a4,address,port);
    sVar3 = 0x10;
  }
LAB_0021807b:
  *sockAddrSize = sVar3;
  return;
}

Assistant:

void setPortAndAddress(quint16 port, const QHostAddress &address, qt_sockaddr *aa, QT_SOCKLEN_T *sockAddrSize)
    {
        switch (socketProtocol) {
        case QHostAddress::IPv6Protocol:
        case QHostAddress::AnyIPProtocol:
            // force to IPv6
            setSockaddr(&aa->a6, address, port);
            *sockAddrSize = sizeof(sockaddr_in6);
            return;

        case QHostAddress::IPv4Protocol:
            // force to IPv4
            setSockaddr(&aa->a4, address, port);
            *sockAddrSize = sizeof(sockaddr_in);
            return;

        case QHostAddress::UnknownNetworkLayerProtocol:
            // don't force
            break;
        }
        *sockAddrSize = setSockaddr(&aa->a, address, port);
    }